

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classarray.h
# Opt level: O1

void __thiscall
soplex::
ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
::insert(ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         *this,int i,int n)

{
  int iVar1;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar2;
  long lVar3;
  undefined4 *puVar4;
  undefined4 *puVar5;
  long lVar6;
  long lVar7;
  byte bVar8;
  
  bVar8 = 0;
  if (0 < n) {
    iVar1 = this->thesize;
    lVar7 = (long)iVar1;
    reSize(this,iVar1 + n);
    if (i < iVar1) {
      lVar6 = lVar7 * 0x84;
      do {
        lVar7 = lVar7 + -1;
        pNVar2 = this->data;
        puVar4 = (undefined4 *)((long)pNVar2[-1].val.m_backend.data._M_elems + lVar6);
        puVar5 = (undefined4 *)
                 ((long)pNVar2[(ulong)(uint)n - 1].val.m_backend.data._M_elems + lVar6);
        for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
          *puVar5 = *puVar4;
          puVar4 = puVar4 + (ulong)bVar8 * -2 + 1;
          puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
        }
        *(undefined4 *)((long)pNVar2[(uint)n].val.m_backend.data._M_elems + lVar6 + -0x14) =
             *(undefined4 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar6 + -0x14);
        *(undefined1 *)((long)pNVar2[(uint)n].val.m_backend.data._M_elems + lVar6 + -0x10) =
             *(undefined1 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar6 + -0x10);
        *(undefined8 *)((long)pNVar2[(uint)n].val.m_backend.data._M_elems + lVar6 + -0xc) =
             *(undefined8 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar6 + -0xc);
        *(undefined4 *)((long)pNVar2[(uint)n].val.m_backend.data._M_elems + lVar6 + -4) =
             *(undefined4 *)((long)(pNVar2->val).m_backend.data._M_elems + lVar6 + -4);
        lVar6 = lVar6 + -0x84;
      } while (i < lVar7);
    }
  }
  return;
}

Assistant:

void insert(int i, int n)
   {
      assert(n >= 0);
      assert(i >= 0);
      assert(i <= thesize);

      if(n > 0)
      {
         int j = thesize;

         reSize(thesize + n);
         assert(thesize == j + n);

         /// move \p n elements in memory from insert position \p i to the back
         while(j > i)
         {
            j--;
            data[j + n] = data[j];
         }
      }
   }